

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O0

Solution * __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::getSolution(PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
              *this)

{
  bool bVar1;
  size_t sVar2;
  PartitionGraph *in_RSI;
  HungarianBranching<lineage::heuristics::PartitionGraph> *in_RDI;
  PartitionGraph *this_00;
  size_t v1;
  size_t v0;
  size_t edge;
  size_t numberOfEdges;
  uchar *branchingEdgeLabel;
  iterator __end0;
  iterator __begin0;
  Solution *__range3;
  size_t branchingEdgeId;
  BranchingOptimizer branchingOptimizer;
  Solution *solution;
  HungarianBranching<lineage::heuristics::PartitionGraph> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  HungarianBranching<lineage::heuristics::PartitionGraph> *this_01;
  HungarianBranching<lineage::heuristics::PartitionGraph> *this_02;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  size_t in_stack_ffffffffffffff38;
  PartitionGraph *in_stack_ffffffffffffff40;
  ulong local_b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  undefined1 local_88 [24];
  undefined1 *local_70;
  long local_68;
  HungarianBranching<lineage::heuristics::PartitionGraph> *in_stack_ffffffffffffffb0;
  
  this_02 = (HungarianBranching<lineage::heuristics::PartitionGraph> *)&stack0xffffffffffffffb0;
  this_01 = in_RDI;
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::HungarianBranching
            (this_02,in_RSI);
  this_00 = (PartitionGraph *)
            branching::HungarianBranching<lineage::heuristics::PartitionGraph>::optimize
                      (in_stack_ffffffffffffffb0);
  in_RSI[1].super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_00;
  local_68 = 0;
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::getSolution
            (in_stack_fffffffffffffef8);
  local_70 = local_88;
  local_90._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffef8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                            (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffffef8), bVar1) {
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator*(&local_90);
    local_68 = local_68 + 1;
    PartitionGraph::updateBranchingLabel
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               SUB41((uint)in_stack_ffffffffffffff34 >> 0x18,0));
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_90);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::~HungarianBranching
            ((HungarianBranching<lineage::heuristics::PartitionGraph> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  ProblemGraph::graph((ProblemGraph *)
                      (((in_RSI->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                        vertices_.
                        super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->from_).vector_.
                      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  sVar2 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfEdges
                    ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1b19e2);
  Solution::Solution((Solution *)0x1b19f6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),(size_type)this_00);
  for (local_b8 = 0; local_b8 < sVar2; local_b8 = local_b8 + 1) {
    ProblemGraph::graph((ProblemGraph *)
                        (((in_RSI->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                          vertices_.
                          super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->from_).vector_.
                        super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
              ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (size_t)in_stack_fffffffffffffef8,0x1b1a42);
    ProblemGraph::graph((ProblemGraph *)
                        (((in_RSI->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                          vertices_.
                          super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->from_).vector_.
                        super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
              ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (size_t)in_stack_fffffffffffffef8,0x1b1a6d);
    in_stack_fffffffffffffef8 = in_RDI;
    in_RDI = in_stack_fffffffffffffef8;
    in_stack_ffffffffffffff07 = PartitionGraph::areConnected(this_00,(size_t)this_02,(size_t)in_RSI)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,(int *)in_RDI);
  }
  return (Solution *)this_01;
}

Assistant:

inline Solution
PartitionOptimizerBase<BROPT>::getSolution()
{
    {
        // for the last time, optimize the branching to get
        // a final edge labelling.
        auto branchingOptimizer = BranchingOptimizer(partitionGraph_);
        branchingObjective_ = branchingOptimizer.optimize();

        size_t branchingEdgeId = 0;
        for (auto&& branchingEdgeLabel : branchingOptimizer.getSolution()) {
            partitionGraph_.updateBranchingLabel(branchingEdgeId++,
                                                 branchingEdgeLabel);
        }
    }

    // construct edge labels.
    const auto numberOfEdges = this->data_.problemGraph.graph().numberOfEdges();
    Solution solution;
    solution.edge_labels.reserve(numberOfEdges);

    for (size_t edge = 0; edge < numberOfEdges; ++edge) {
        const auto v0 = this->data_.problemGraph.graph().vertexOfEdge(edge, 0);
        const auto v1 = this->data_.problemGraph.graph().vertexOfEdge(edge, 1);

        solution.edge_labels.emplace_back(
            partitionGraph_.areConnected(v0, v1) ? 0 : 1);
    }
    return solution;
}